

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O0

int Abc_ObjFanoutFaninNum(Abc_Obj_t *pFanout,Abc_Obj_t *pFanin)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin_local;
  Abc_Obj_t *pFanout_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Abc_ObjFaninNum(pFanout);
    if (iVar1 <= local_2c) {
      return -1;
    }
    pAVar2 = Abc_ObjFanin(pFanout,local_2c);
    if (pAVar2 == pFanin) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int Abc_ObjFanoutFaninNum( Abc_Obj_t * pFanout, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj == pFanin )
            return i;
    return -1;
}